

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O0

void Abc_NtkManRefStop(Abc_ManRef_t *p)

{
  Abc_ManRef_t *p_local;
  
  Vec_PtrFreeFree(p->vFuncs);
  Vec_PtrFree(p->vVars);
  Vec_IntFree(p->vMemory);
  Vec_PtrFree(p->vVisited);
  Vec_StrFree(p->vCube);
  if (p != (Abc_ManRef_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Abc_NtkManRefStop( Abc_ManRef_t * p )
{
    Vec_PtrFreeFree( p->vFuncs );
    Vec_PtrFree( p->vVars );
    Vec_IntFree( p->vMemory );
    Vec_PtrFree( p->vVisited );
    Vec_StrFree( p->vCube );
    ABC_FREE( p );
}